

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

void duckdb::HTTPLoggingOutputSetting::ResetLocal(ClientContext *context)

{
  ClientConfig *pCVar1;
  undefined1 auStack_1f8 [488];
  
  switchD_0049f7f1::default(auStack_1f8,0,0x1e8);
  ClientConfig::ClientConfig((ClientConfig *)auStack_1f8);
  pCVar1 = ClientConfig::GetConfig(context);
  ::std::__cxx11::string::operator=
            ((string *)&pCVar1->http_logging_output,(string *)(auStack_1f8 + 0x1c8));
  ClientConfig::~ClientConfig((ClientConfig *)auStack_1f8);
  return;
}

Assistant:

void HTTPLoggingOutputSetting::ResetLocal(ClientContext &context) {
	ClientConfig::GetConfig(context).http_logging_output = ClientConfig().http_logging_output;
}